

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int zisofs_write_to_temp(archive_write *a,void *buff,size_t s)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  archive *paVar4;
  int iVar5;
  uchar *puVar6;
  long lVar7;
  ulong in_RDX;
  archive_write *in_RSI;
  archive_write *in_RDI;
  int64_t diff;
  uchar *nonzeroend;
  uchar *nonzero;
  int r;
  int flush;
  size_t csize;
  size_t avail;
  z_stream *zstrm;
  uchar *b;
  isofile *file;
  iso9660_conflict *iso9660;
  size_t in_stack_ffffffffffffff90;
  archive_write *in_stack_ffffffffffffff98;
  archive_write *in_stack_ffffffffffffffa0;
  archive_write *paVar8;
  uint in_stack_ffffffffffffffa8;
  int iVar9;
  ulong local_48;
  archive_write *local_38;
  ulong local_20;
  
  pvVar1 = in_RDI->format_data;
  lVar2 = *(long *)((long)pvVar1 + 0x10);
  puVar6 = wb_buffptr(in_RDI);
  *(uchar **)((long)pvVar1 + 0x260) = puVar6;
  *(int *)((long)pvVar1 + 0x268) = (int)*(undefined8 *)((long)in_RDI->format_data + 0x102e0);
  local_38 = in_RSI;
  local_20 = in_RDX;
  do {
    local_48 = 0x8000 - *(long *)((long)pvVar1 + 600);
    if (local_20 < local_48) {
      local_48 = local_20;
      iVar9 = 0;
    }
    else {
      iVar9 = 4;
    }
    *(ulong *)((long)pvVar1 + 0x2c0) = *(long *)((long)pvVar1 + 0x2c0) - local_48;
    if (*(long *)((long)pvVar1 + 0x2c0) < 1) {
      iVar9 = 4;
    }
    *(undefined8 *)((long)pvVar1 + 0x248) = local_38;
    *(int *)((long)pvVar1 + 0x250) = (int)local_48;
    if ((char)(*(char *)((long)pvVar1 + 0x1d8) << 5) < '\0') {
      in_stack_ffffffffffffff98 = (archive_write *)((long)&(local_38->archive).magic + local_48);
      paVar8 = local_38;
      do {
        in_stack_ffffffffffffffa0 = paVar8;
        if (in_stack_ffffffffffffff98 <= paVar8) goto LAB_001803bd;
        in_stack_ffffffffffffffa0 = (archive_write *)((long)&(paVar8->archive).magic + 1);
        paVar4 = &paVar8->archive;
        paVar8 = in_stack_ffffffffffffffa0;
      } while ((char)paVar4->magic == '\0');
      *(byte *)((long)pvVar1 + 0x1d8) = *(byte *)((long)pvVar1 + 0x1d8) & 0xfb;
    }
LAB_001803bd:
    local_38 = (archive_write *)((long)&(local_38->archive).magic + local_48);
    local_20 = local_20 - local_48;
    if (((iVar9 == 4) && ((char)(*(char *)((long)pvVar1 + 0x1d8) << 5) < '\0')) &&
       (local_48 + *(long *)((long)pvVar1 + 600) == 0x8000)) {
      if (*(long *)((long)pvVar1 + 0x240) != *(long *)(*(long *)(lVar2 + 0xb0) + 8)) {
        iVar5 = wb_set_offset((archive_write *)CONCAT44(4,in_stack_ffffffffffffffa8),
                              (int64_t)in_stack_ffffffffffffffa0);
        if (iVar5 != 0) {
          return iVar5;
        }
        in_stack_ffffffffffffff90 =
             *(long *)(*(long *)(lVar2 + 0xb0) + 8) - *(long *)((long)pvVar1 + 0x240);
        *(size_t *)(*(long *)(lVar2 + 0xb0) + 8) =
             *(long *)(*(long *)(lVar2 + 0xb0) + 8) - in_stack_ffffffffffffff90;
        *(size_t *)((long)pvVar1 + 0x238) =
             *(long *)((long)pvVar1 + 0x238) - in_stack_ffffffffffffff90;
        in_stack_ffffffffffffffa8 = 0;
      }
      *(undefined4 *)((long)pvVar1 + 0x250) = 0;
    }
    while (*(int *)((long)pvVar1 + 0x250) != 0) {
      lVar7 = *(long *)((long)pvVar1 + 0x270);
      in_stack_ffffffffffffffa8 = deflate((undefined8 *)((long)pvVar1 + 0x248),iVar9);
      if (1 < in_stack_ffffffffffffffa8) {
        archive_set_error(&in_RDI->archive,-1,
                          "Compression failed: deflate() call returned status %d",
                          (ulong)in_stack_ffffffffffffffa8);
        return -0x1e;
      }
      lVar7 = *(long *)((long)pvVar1 + 0x270) - lVar7;
      iVar5 = wb_consume(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      if (iVar5 != 0) {
        return -0x1e;
      }
      *(long *)((long)pvVar1 + 0x238) = lVar7 + *(long *)((long)pvVar1 + 0x238);
      lVar3 = *(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0);
      *(long *)(lVar3 + 8) = lVar7 + *(long *)(lVar3 + 8);
      puVar6 = wb_buffptr(in_RDI);
      *(uchar **)((long)pvVar1 + 0x260) = puVar6;
      *(int *)((long)pvVar1 + 0x268) = (int)*(undefined8 *)((long)in_RDI->format_data + 0x102e0);
    }
    if (iVar9 == 4) {
      *(int *)((long)pvVar1 + 0x234) = *(int *)((long)pvVar1 + 0x234) + 1;
      archive_le32enc((void *)(*(long *)((long)pvVar1 + 0x220) +
                              (long)*(int *)((long)pvVar1 + 0x234) * 4),
                      (uint32_t)*(undefined8 *)((long)pvVar1 + 0x238));
      iVar9 = zisofs_init_zstream(in_stack_ffffffffffffff98);
      if (iVar9 != 0) {
        return -0x1e;
      }
      *(byte *)((long)pvVar1 + 0x1d8) = *(byte *)((long)pvVar1 + 0x1d8) & 0xfb | 4;
      *(undefined8 *)((long)pvVar1 + 0x240) = *(undefined8 *)(*(long *)(lVar2 + 0xb0) + 8);
      in_stack_ffffffffffffffa8 = 0;
    }
    if (local_20 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
zisofs_write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file = iso9660->cur_file;
	const unsigned char *b;
	z_stream *zstrm;
	size_t avail, csize;
	int flush, r;

	zstrm = &(iso9660->zisofs.stream);
	zstrm->next_out = wb_buffptr(a);
	zstrm->avail_out = (uInt)wb_remaining(a);
	b = (const unsigned char *)buff;
	do {
		avail = ZF_BLOCK_SIZE - zstrm->total_in;
		if (s < avail) {
			avail = s;
			flush = Z_NO_FLUSH;
		} else
			flush = Z_FINISH;
		iso9660->zisofs.remaining -= avail;
		if (iso9660->zisofs.remaining <= 0)
			flush = Z_FINISH;

		zstrm->next_in = (Bytef *)(uintptr_t)(const void *)b;
		zstrm->avail_in = (uInt)avail;

		/*
		 * Check if current data block are all zero.
		 */
		if (iso9660->zisofs.allzero) {
			const unsigned char *nonzero = b;
			const unsigned char *nonzeroend = b + avail;

			while (nonzero < nonzeroend)
				if (*nonzero++) {
					iso9660->zisofs.allzero = 0;
					break;
				}
		}
		b += avail;
		s -= avail;

		/*
		 * If current data block are all zero, we do not use
		 * compressed data.
		 */
		if (flush == Z_FINISH && iso9660->zisofs.allzero &&
		    avail + zstrm->total_in == ZF_BLOCK_SIZE) {
			if (iso9660->zisofs.block_offset !=
			    file->cur_content->size) {
				int64_t diff;

				r = wb_set_offset(a,
				    file->cur_content->offset_of_temp +
				        iso9660->zisofs.block_offset);
				if (r != ARCHIVE_OK)
					return (r);
				diff = file->cur_content->size -
				    iso9660->zisofs.block_offset;
				file->cur_content->size -= diff;
				iso9660->zisofs.total_size -= diff;
			}
			zstrm->avail_in = 0;
		}

		/*
		 * Compress file data.
		 */
		while (zstrm->avail_in > 0) {
			csize = zstrm->total_out;
			r = deflate(zstrm, flush);
			switch (r) {
			case Z_OK:
			case Z_STREAM_END:
				csize = zstrm->total_out - csize;
				if (wb_consume(a, csize) != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
				iso9660->zisofs.total_size += csize;
				iso9660->cur_file->cur_content->size += csize;
				zstrm->next_out = wb_buffptr(a);
				zstrm->avail_out = (uInt)wb_remaining(a);
				break;
			default:
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Compression failed:"
				    " deflate() call returned status %d",
				    r);
				return (ARCHIVE_FATAL);
			}
		}

		if (flush == Z_FINISH) {
			/*
			 * Save the information of one zisofs block.
			 */
			iso9660->zisofs.block_pointers_idx ++;
			archive_le32enc(&(iso9660->zisofs.block_pointers[
			    iso9660->zisofs.block_pointers_idx]),
				(uint32_t)iso9660->zisofs.total_size);
			r = zisofs_init_zstream(a);
			if (r != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			iso9660->zisofs.allzero = 1;
			iso9660->zisofs.block_offset = file->cur_content->size;
		}
	} while (s);

	return (ARCHIVE_OK);
}